

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Help_View.cxx
# Opt level: O0

int __thiscall
Fl_Help_View::do_align(Fl_Help_View *this,Fl_Help_Block *block,int line,int xx,int a,int *l)

{
  int local_34;
  int offset;
  int *l_local;
  int a_local;
  int xx_local;
  int line_local;
  Fl_Help_Block *block_local;
  Fl_Help_View *this_local;
  
  if (a == -1) {
    local_34 = block->w - xx;
  }
  else if (a == 0) {
    local_34 = (block->w - xx) / 2;
  }
  else {
    local_34 = 0;
  }
  block->line[line] = block->x + local_34;
  a_local = line;
  if (line < 0x1f) {
    a_local = line + 1;
  }
  while (*l < this->nlinks_) {
    this->links_[*l].x = local_34 + this->links_[*l].x;
    this->links_[*l].w = local_34 + this->links_[*l].w;
    *l = *l + 1;
  }
  return a_local;
}

Assistant:

int						// O - New line
Fl_Help_View::do_align(Fl_Help_Block *block,	// I - Block to add to
                      int          line,	// I - Current line
		      int          xx,		// I - Current X position
		      int          a,		// I - Current alignment
		      int          &l)		// IO - Starting link
{
  int	offset;					// Alignment offset


  switch (a)
  {
    case RIGHT :	// Right align
	offset = block->w - xx;
	break;
    case CENTER :	// Center
	offset = (block->w - xx) / 2;
	break;
    default :		// Left align
	offset = 0;
	break;
  }

  block->line[line] = block->x + offset;

  if (line < 31)
    line ++;

  while (l < nlinks_)
  {
    links_[l].x += offset;
    links_[l].w += offset;
    l ++;
  }

  return (line);
}